

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall ChainstateManager::~ChainstateManager(ChainstateManager *this)

{
  VersionBitsCache *this_00;
  CCheckQueue<CScriptCheck> *in_RDI;
  long in_FS_OFFSET;
  AnnotatedMixin<std::recursive_mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_00000008;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  BlockManager *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  this_00 = (VersionBitsCache *)
            MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      (&in_stack_ffffffffffffffc8->cs_LastBlockFile);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,pszName,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,SUB41((uint)in_stack_ffffffffffffffe8 >> 0x18,0));
  VersionBitsCache::Clear(this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffc8);
  VersionBitsCache::~VersionBitsCache
            ((VersionBitsCache *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::~set
            ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
             in_stack_ffffffffffffffc8);
  ValidationCache::~ValidationCache((ValidationCache *)in_stack_ffffffffffffffc8);
  ::node::BlockManager::~BlockManager(in_stack_ffffffffffffffc8);
  kernel::ChainstateManagerOpts::~ChainstateManagerOpts
            ((ChainstateManagerOpts *)in_stack_ffffffffffffffc8);
  std::function<void_()>::~function((function<void_()> *)in_stack_ffffffffffffffc8);
  CCheckQueue<CScriptCheck>::~CCheckQueue(in_RDI);
  std::
  array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
  ::~array((array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
            *)this_00);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)this_00);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)this_00);
  if (*(char **)(in_FS_OFFSET + 0x28) == pszName) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateManager::~ChainstateManager()
{
    LOCK(::cs_main);

    m_versionbitscache.Clear();
}